

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

RPCHelpMan * getaddednodeinfo(void)

{
  string name;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  Fallback fallback;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_08;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  long lVar1;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  undefined8 in_stack_fffffffffffff4b8;
  undefined8 in_stack_fffffffffffff4c0;
  undefined8 in_stack_fffffffffffff4c8;
  undefined8 in_stack_fffffffffffff4d0;
  _Manager_type in_stack_fffffffffffff4d8;
  undefined8 in_stack_fffffffffffff4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff4e8;
  pointer in_stack_fffffffffffff4f8;
  pointer pRVar2;
  pointer in_stack_fffffffffffff500;
  pointer pRVar3;
  pointer in_stack_fffffffffffff508;
  pointer pRVar4;
  undefined8 in_stack_fffffffffffff510;
  pointer in_stack_fffffffffffff518;
  pointer pRVar5;
  pointer in_stack_fffffffffffff520;
  pointer pRVar6;
  pointer in_stack_fffffffffffff528;
  pointer pRVar7;
  undefined8 in_stack_fffffffffffff530;
  pointer in_stack_fffffffffffff538;
  pointer in_stack_fffffffffffff540;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff548;
  undefined1 in_stack_fffffffffffff558 [16];
  undefined1 in_stack_fffffffffffff568 [16];
  pointer in_stack_fffffffffffff578;
  pointer in_stack_fffffffffffff580;
  pointer in_stack_fffffffffffff588;
  undefined8 in_stack_fffffffffffff590;
  pointer in_stack_fffffffffffff598;
  allocator<char> local_a4a;
  allocator<char> local_a49;
  vector<RPCResult,_std::allocator<RPCResult>_> local_a48;
  allocator<char> local_a2a;
  allocator<char> local_a29;
  vector<RPCResult,_std::allocator<RPCResult>_> local_a28;
  allocator<char> local_a0a;
  allocator<char> local_a09;
  RPCResults local_a08;
  allocator_type local_9ec;
  allocator<char> local_9eb;
  allocator<char> local_9ea;
  allocator<char> local_9e9;
  vector<RPCArg,_std::allocator<RPCArg>_> local_9e8;
  allocator<char> local_9ca;
  allocator<char> local_9c9;
  string local_9c8;
  string local_9a8;
  string local_988;
  string local_968;
  string local_948;
  string local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  char *local_8e8;
  size_type local_8e0;
  char local_8d8 [8];
  undefined8 uStack_8d0;
  string local_8c8 [32];
  string local_8a8 [32];
  string local_888 [32];
  string local_868 [32];
  RPCResult local_848 [2];
  string local_738 [32];
  string local_718 [32];
  RPCResult local_6f8;
  string local_670 [32];
  string local_650 [32];
  string local_630 [32];
  string local_610 [32];
  string local_5f0 [32];
  string local_5d0 [32];
  RPCResult local_5b0 [3];
  string local_418 [32];
  string local_3f8 [32];
  RPCResult local_3d8;
  string local_350 [32];
  string local_330 [32];
  RPCResult local_310;
  RPCArgOptions local_288;
  string local_240 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_200;
  string local_1a0 [32];
  RPCArg local_180;
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"getaddednodeinfo",&local_9c9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,
             "\nReturns information about the given added node, or all added nodes\n(note that onetry addnodes are not listed here)\n"
             ,&local_9ca);
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"node",&local_9e9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"all nodes",&local_9ea);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_200,&local_220);
  std::__cxx11::string::string<std::allocator<char>>
            (local_240,
             "If provided, return information about this specific node, otherwise all nodes are returned."
             ,&local_9eb);
  local_288.oneline_description._M_dataplus._M_p = (pointer)&local_288.oneline_description.field_2;
  local_288.skip_type_check = false;
  local_288.oneline_description._M_string_length = 0;
  local_288.oneline_description.field_2._M_local_buf[0] = '\0';
  local_288.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_288.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_288.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_288._58_8_ = 0;
  name._M_string_length = in_stack_fffffffffffff4c0;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4b8;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff4c8;
  name.field_2._8_8_ = in_stack_fffffffffffff4d0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff4e0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff4d8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff4e8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff4f8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff500;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff508;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff510;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff518;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff520;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff528;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff530;
  description_08._M_string_length = (size_type)in_stack_fffffffffffff540;
  description_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff538;
  description_08.field_2 = in_stack_fffffffffffff548;
  opts.oneline_description._8_16_ = in_stack_fffffffffffff568;
  opts.skip_type_check = (bool)in_stack_fffffffffffff558[0];
  opts._1_7_ = in_stack_fffffffffffff558._1_7_;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558._8_8_;
  opts.oneline_description.field_2._8_8_ = in_stack_fffffffffffff578;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff580;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff588;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff590;
  opts._64_8_ = in_stack_fffffffffffff598;
  RPCArg::RPCArg(&local_180,name,(Type)local_1a0,fallback,description_08,opts);
  __l._M_len = 1;
  __l._M_array = &local_180;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_9e8,__l,&local_9ec);
  std::__cxx11::string::string<std::allocator<char>>(local_330,"",&local_a09);
  std::__cxx11::string::string<std::allocator<char>>(local_350,"",&local_a0a);
  std::__cxx11::string::string<std::allocator<char>>(local_3f8,"",&local_a29);
  std::__cxx11::string::string<std::allocator<char>>(local_418,"",&local_a2a);
  std::__cxx11::string::string<std::allocator<char>>(local_5d0,"addednode",&local_a49);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5f0,"The node IP address or name (as provided to addnode)",&local_a4a);
  m_key_name._M_string_length = in_stack_fffffffffffff4c0;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4b8;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff4c8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff4d0;
  description._M_string_length = in_stack_fffffffffffff4e0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4d8;
  description.field_2 = in_stack_fffffffffffff4e8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff500;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff4f8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff508;
  RPCResult::RPCResult(local_5b0,STR,m_key_name,description,inner,SUB81(local_5d0,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_610,"connected",(allocator<char> *)&stack0xfffffffffffff597);
  std::__cxx11::string::string<std::allocator<char>>
            (local_630,"If connected",(allocator<char> *)&stack0xfffffffffffff596);
  m_key_name_00._M_string_length = in_stack_fffffffffffff4c0;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4b8;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff4c8;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff4d0;
  description_00._M_string_length = in_stack_fffffffffffff4e0;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4d8;
  description_00.field_2 = in_stack_fffffffffffff4e8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff500;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff4f8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff508;
  RPCResult::RPCResult(local_5b0 + 1,BOOL,m_key_name_00,description_00,inner_00,SUB81(local_610,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_650,"addresses",(allocator<char> *)&stack0xfffffffffffff577);
  std::__cxx11::string::string<std::allocator<char>>
            (local_670,"Only when connected = true",(allocator<char> *)&stack0xfffffffffffff576);
  std::__cxx11::string::string<std::allocator<char>>
            (local_718,"",(allocator<char> *)&stack0xfffffffffffff557);
  std::__cxx11::string::string<std::allocator<char>>
            (local_738,"",(allocator<char> *)&stack0xfffffffffffff556);
  std::__cxx11::string::string<std::allocator<char>>
            (local_868,"address",(allocator<char> *)&stack0xfffffffffffff537);
  std::__cxx11::string::string<std::allocator<char>>
            (local_888,"The bitcoin server IP and port we\'re connected to",
             (allocator<char> *)&stack0xfffffffffffff536);
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  m_key_name_01._M_string_length = in_stack_fffffffffffff4c0;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4b8;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff4c8;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff4d0;
  description_01._M_string_length = in_stack_fffffffffffff4e0;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4d8;
  description_01.field_2 = in_stack_fffffffffffff4e8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff500;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff4f8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff508;
  RPCResult::RPCResult(local_848,STR,m_key_name_01,description_01,inner_01,SUB81(local_868,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_8a8,"connected",(allocator<char> *)&stack0xfffffffffffff517);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8c8,"connection, inbound or outbound",(allocator<char> *)&stack0xfffffffffffff516
            );
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  pRVar4 = (pointer)0x0;
  m_key_name_02._M_string_length = in_stack_fffffffffffff4c0;
  m_key_name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4b8;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff4c8;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff4d0;
  description_02._M_string_length = in_stack_fffffffffffff4e0;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4d8;
  description_02.field_2._M_local_buf = in_stack_fffffffffffff4e8._M_local_buf;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(local_848 + 1,STR,m_key_name_02,description_02,inner_02,SUB81(local_8a8,0));
  __l_00._M_len = 2;
  __l_00._M_array = local_848;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff538,__l_00,
             (allocator_type *)&stack0xfffffffffffff4f7);
  m_key_name_03._M_string_length = in_stack_fffffffffffff4c0;
  m_key_name_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4b8;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff4c8;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff4d0;
  description_03._M_string_length = in_stack_fffffffffffff4e0;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4d8;
  description_03.field_2._M_local_buf = in_stack_fffffffffffff4e8._M_local_buf;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar3;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar2;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar4;
  RPCResult::RPCResult(&local_6f8,OBJ,m_key_name_03,description_03,inner_03,SUB81(local_718,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_6f8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff558,__l_01,
             (allocator_type *)&stack0xfffffffffffff4f6);
  m_key_name_04._M_string_length = in_stack_fffffffffffff4c0;
  m_key_name_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4b8;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_fffffffffffff4c8;
  m_key_name_04.field_2._8_8_ = in_stack_fffffffffffff4d0;
  description_04._M_string_length = in_stack_fffffffffffff4e0;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4d8;
  description_04.field_2._M_local_buf = in_stack_fffffffffffff4e8._M_local_buf;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar3;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar2;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar4;
  RPCResult::RPCResult(local_5b0 + 2,ARR,m_key_name_04,description_04,inner_04,SUB81(local_650,0));
  __l_02._M_len = 3;
  __l_02._M_array = local_5b0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_a48,__l_02,(allocator_type *)&stack0xfffffffffffff4f5);
  m_key_name_05._M_string_length = in_stack_fffffffffffff4c0;
  m_key_name_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4b8;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_fffffffffffff4c8;
  m_key_name_05.field_2._8_8_ = in_stack_fffffffffffff4d0;
  description_05._M_string_length = in_stack_fffffffffffff4e0;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4d8;
  description_05.field_2._M_local_buf = in_stack_fffffffffffff4e8._M_local_buf;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar3;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar2;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar4;
  RPCResult::RPCResult(&local_3d8,OBJ,m_key_name_05,description_05,inner_05,SUB81(local_3f8,0));
  __l_03._M_len = 1;
  __l_03._M_array = &local_3d8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_a28,__l_03,(allocator_type *)&stack0xfffffffffffff4f4);
  m_key_name_06._M_string_length = in_stack_fffffffffffff4c0;
  m_key_name_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4b8;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_fffffffffffff4c8;
  m_key_name_06.field_2._8_8_ = in_stack_fffffffffffff4d0;
  description_06._M_string_length = in_stack_fffffffffffff4e0;
  description_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4d8;
  description_06.field_2 = in_stack_fffffffffffff4e8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar3;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar2;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar4;
  RPCResult::RPCResult(&local_310,ARR,m_key_name_06,description_06,inner_06,SUB81(local_330,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4c0;
  result._0_8_ = in_stack_fffffffffffff4b8;
  result.m_key_name._M_string_length = in_stack_fffffffffffff4c8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff4d0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff4d8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff4e0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff4e8;
  result._64_8_ = pRVar2;
  result.m_description._M_dataplus._M_p = (pointer)pRVar3;
  result.m_description._M_string_length = (size_type)pRVar4;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff510;
  result.m_description.field_2._8_8_ = pRVar5;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar6;
  result.m_cond._M_string_length = (size_type)pRVar7;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffff530;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffff538;
  RPCResults::RPCResults(&local_a08,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_948,"getaddednodeinfo",(allocator<char> *)&stack0xfffffffffffff4f3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_968,"\"192.168.0.201\"",(allocator<char> *)&stack0xfffffffffffff4f2);
  HelpExampleCli(&local_928,&local_948,&local_968);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9a8,"getaddednodeinfo",(allocator<char> *)&stack0xfffffffffffff4f1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9c8,"\"192.168.0.201\"",(allocator<char> *)&stack0xfffffffffffff4f0);
  HelpExampleRpc(&local_988,&local_9a8,&local_9c8);
  std::operator+(&local_908,&local_928,&local_988);
  local_8e8 = local_8d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908._M_dataplus._M_p == &local_908.field_2) {
    uStack_8d0 = local_908.field_2._8_8_;
  }
  else {
    local_8e8 = local_908._M_dataplus._M_p;
  }
  local_8e0 = local_908._M_string_length;
  local_908._M_string_length = 0;
  local_908.field_2._M_local_buf[0] = '\0';
  description_07._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/net.cpp:506:9)>
       ::_M_invoke;
  description_07._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/net.cpp:506:9)>
                ::_M_manager;
  description_07.field_2 = in_stack_fffffffffffff4e8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar3;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar4;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar5;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff510;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar6;
  examples.m_examples._M_string_length = in_stack_fffffffffffff530;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar7;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff538;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffff540;
  fun.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffff558._0_8_;
  fun._M_invoker = (_Invoker_type)in_stack_fffffffffffff558._8_8_;
  fun.super__Function_base._M_functor._M_pod_data = in_stack_fffffffffffff548._M_local_buf;
  local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff4c0,&stack0xfffffffffffff4c8)),
             description_07,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff4c8);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::string::~string((string *)&local_988);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::__cxx11::string::~string((string *)&local_928);
  std::__cxx11::string::~string((string *)&local_968);
  std::__cxx11::string::~string((string *)&local_948);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a08.m_results);
  RPCResult::~RPCResult(&local_310);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a28);
  RPCResult::~RPCResult(&local_3d8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a48);
  lVar1 = 0x110;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_5b0[0].m_type + lVar1));
    lVar1 = lVar1 + -0x88;
  } while (lVar1 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff558);
  RPCResult::~RPCResult(&local_6f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff538);
  lVar1 = 0x88;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_848[0].m_type + lVar1));
    lVar1 = lVar1 + -0x88;
  } while (lVar1 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff4f8);
  std::__cxx11::string::~string(local_8c8);
  std::__cxx11::string::~string(local_8a8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff518);
  std::__cxx11::string::~string(local_888);
  std::__cxx11::string::~string(local_868);
  std::__cxx11::string::~string(local_738);
  std::__cxx11::string::~string(local_718);
  std::__cxx11::string::~string(local_670);
  std::__cxx11::string::~string(local_650);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff578);
  std::__cxx11::string::~string(local_630);
  std::__cxx11::string::~string(local_610);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff598);
  std::__cxx11::string::~string(local_5f0);
  std::__cxx11::string::~string(local_5d0);
  std::__cxx11::string::~string(local_418);
  std::__cxx11::string::~string(local_3f8);
  std::__cxx11::string::~string(local_350);
  std::__cxx11::string::~string(local_330);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_9e8);
  RPCArg::~RPCArg(&local_180);
  RPCArgOptions::~RPCArgOptions(&local_288);
  std::__cxx11::string::~string(local_240);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getaddednodeinfo()
{
    return RPCHelpMan{"getaddednodeinfo",
                "\nReturns information about the given added node, or all added nodes\n"
                "(note that onetry addnodes are not listed here)\n",
                {
                    {"node", RPCArg::Type::STR, RPCArg::DefaultHint{"all nodes"}, "If provided, return information about this specific node, otherwise all nodes are returned."},
                },
                RPCResult{
                    RPCResult::Type::ARR, "", "",
                    {
                        {RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::STR, "addednode", "The node IP address or name (as provided to addnode)"},
                            {RPCResult::Type::BOOL, "connected", "If connected"},
                            {RPCResult::Type::ARR, "addresses", "Only when connected = true",
                            {
                                {RPCResult::Type::OBJ, "", "",
                                {
                                    {RPCResult::Type::STR, "address", "The bitcoin server IP and port we're connected to"},
                                    {RPCResult::Type::STR, "connected", "connection, inbound or outbound"},
                                }},
                            }},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("getaddednodeinfo", "\"192.168.0.201\"")
            + HelpExampleRpc("getaddednodeinfo", "\"192.168.0.201\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    NodeContext& node = EnsureAnyNodeContext(request.context);
    const CConnman& connman = EnsureConnman(node);

    std::vector<AddedNodeInfo> vInfo = connman.GetAddedNodeInfo(/*include_connected=*/true);

    if (!request.params[0].isNull()) {
        bool found = false;
        for (const AddedNodeInfo& info : vInfo) {
            if (info.m_params.m_added_node == request.params[0].get_str()) {
                vInfo.assign(1, info);
                found = true;
                break;
            }
        }
        if (!found) {
            throw JSONRPCError(RPC_CLIENT_NODE_NOT_ADDED, "Error: Node has not been added.");
        }
    }

    UniValue ret(UniValue::VARR);

    for (const AddedNodeInfo& info : vInfo) {
        UniValue obj(UniValue::VOBJ);
        obj.pushKV("addednode", info.m_params.m_added_node);
        obj.pushKV("connected", info.fConnected);
        UniValue addresses(UniValue::VARR);
        if (info.fConnected) {
            UniValue address(UniValue::VOBJ);
            address.pushKV("address", info.resolvedAddress.ToStringAddrPort());
            address.pushKV("connected", info.fInbound ? "inbound" : "outbound");
            addresses.push_back(std::move(address));
        }
        obj.pushKV("addresses", std::move(addresses));
        ret.push_back(std::move(obj));
    }

    return ret;
},
    };
}